

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  undefined1 auVar2 [16];
  JSValue val;
  int iVar3;
  int iVar4;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  void *pvVar7;
  JSValueUnion JVar8;
  JSRuntime *rt;
  int64_t iVar9;
  JSRefCountHeader *p_1;
  ulong uVar10;
  JSValue JVar11;
  JSValue JVar12;
  JSValue prop;
  JSValue prop_00;
  long local_40;
  void *local_38;
  
  JVar8 = this_val.u;
  if (argc < 2) {
    iVar9 = 3;
    JVar5.float64 = 0.0;
  }
  else {
    JVar5 = (JSValueUnion)argv[1].u.ptr;
    iVar9 = argv[1].tag;
  }
  if (((int)this_val.tag != -1) || (8 < (ushort)(*(short *)((long)JVar8.ptr + 6) - 0x15U))) {
    JS_ThrowTypeError(ctx,"not a %s","TypedArray");
    uVar10 = 6;
    goto LAB_0016ac16;
  }
  JVar11 = *argv;
  if (0xfffffff4 < (uint)iVar9) {
    *(int *)JVar5.ptr = *JVar5.ptr + 1;
  }
  JVar12.tag = iVar9;
  JVar12.u.ptr = JVar5.ptr;
  iVar3 = JS_ToInt64SatFree(ctx,&local_40,JVar12);
  uVar10 = 6;
  if (iVar3 != 0) goto LAB_0016ac16;
  if (local_40 < 0) {
    JVar11 = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_0016ac33;
  }
  if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar8.ptr + 0x30) + 0x18) + 0x30) + 4) == '\0')
  {
    JVar11 = JS_ToObject(ctx,JVar11);
    JVar5 = JVar11.u;
    if ((uint)JVar11.tag == 6) goto LAB_0016ad0d;
    if (8 < (ushort)(*(ushort *)((long)JVar5.ptr + 6) - 0x15)) {
      iVar3 = js_get_length64(ctx,(int64_t *)&local_38,JVar11);
      if (iVar3 == 0) {
        pvVar7 = local_38;
        if (local_40 <= (long)((ulong)*(uint *)((long)JVar8.ptr + 0x40) - (long)local_38)) {
LAB_0016ad56:
          if (0 < (long)pvVar7) {
            JVar8.float64 = 0.0;
            do {
              iVar3 = JVar8.int32;
              JVar6.float64 = (double)JVar8.float64;
              if (-1 < iVar3) {
                JVar6 = JVar8;
              }
              iVar9 = 7;
              if (-1 < iVar3) {
                iVar9 = 0;
              }
              prop.tag = iVar9;
              prop.u.float64 = JVar6.float64;
              JVar12 = JS_GetPropertyValue(ctx,JVar11,prop);
              if ((int)JVar12.tag == 6) goto LAB_0016ad0d;
              JVar6._0_4_ = (int)local_40 + iVar3;
              JVar6._4_4_ = 0;
              JVar8.float64 = (double)JVar6.float64;
              if (-1 < (int)JVar6._0_4_) {
                JVar8 = JVar6;
              }
              iVar9 = 7;
              if (-1 < (int)JVar6._0_4_) {
                iVar9 = 0;
              }
              val.tag = 0x4000;
              val.u = (JSValueUnion)(JSValueUnion)JVar12.tag;
              prop_00.tag = iVar9;
              prop_00.u.float64 = JVar8.float64;
              iVar4 = JS_SetPropertyValue(ctx,this_val,prop_00,val,JVar12.u._0_4_);
              if (iVar4 < 0) goto LAB_0016ad0d;
              JVar8._0_4_ = iVar3 + 1;
              JVar8._4_4_ = 0;
            } while (JVar8.ptr < pvVar7);
          }
          goto LAB_0016ae0b;
        }
LAB_0016ac33:
        JS_ThrowRangeError(ctx,"invalid array length");
      }
      goto LAB_0016ad0d;
    }
    lVar1 = *(long *)(*(long *)(*(long *)((long)JVar5.ptr + 0x30) + 0x18) + 0x30);
    if (*(char *)(lVar1 + 4) != '\0') goto LAB_0016abe2;
    pvVar7 = (void *)(ulong)*(uint *)((long)JVar5.ptr + 0x40);
    if ((long)((ulong)*(uint *)((long)JVar8.ptr + 0x40) - (long)pvVar7) < local_40)
    goto LAB_0016ac33;
    if (*(ushort *)((long)JVar5.ptr + 6) != *(ushort *)((long)JVar8.ptr + 6)) goto LAB_0016ad56;
    memmove((void *)((local_40 << ("includes"[(ulong)*(ushort *)((long)JVar8.ptr + 6) + 1] & 0x3fU))
                    + (ulong)*(uint *)(*(long *)((long)JVar8.ptr + 0x30) + 0x20) +
                      *(long *)(*(long *)(*(long *)(*(long *)((long)JVar8.ptr + 0x30) + 0x18) + 0x30
                                         ) + 8)),
            (void *)((ulong)*(uint *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20) +
                    *(long *)(lVar1 + 8)),
            (long)pvVar7 << ("includes"[(ulong)*(ushort *)((long)JVar8.ptr + 6) + 1] & 0x3fU));
LAB_0016ae0b:
    uVar10 = 3;
    if (((uint)JVar11.tag < 0xfffffff5) ||
       (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, 1 < iVar3)) goto LAB_0016ac16;
    rt = ctx->rt;
  }
  else {
    JVar11 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0016abe2:
    JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
LAB_0016ad0d:
    if (((uint)JVar11.tag < 0xfffffff5) ||
       (iVar3 = *JVar11.u.ptr, *(int *)JVar11.u.ptr = iVar3 + -1, 1 < iVar3)) goto LAB_0016ac16;
    rt = ctx->rt;
  }
  __JS_FreeValueRT(rt,JVar11);
LAB_0016ac16:
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  return (JSValue)(auVar2 << 0x40);
}

Assistant:

static JSValue js_typed_array_set(JSContext *ctx,
                                  JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst offset = JS_UNDEFINED;
    if (argc > 1) {
        offset = argv[1];
    }
    return js_typed_array_set_internal(ctx, this_val, argv[0], offset);
}